

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateWriter.cpp
# Opt level: O3

EStatusCode __thiscall StateWriter::Finish(StateWriter *this)

{
  EStatusCode EVar1;
  LongFilePositionType xrefTablePosition;
  longlong local_20;
  
  EVar1 = ObjectsContext::WriteXrefTable(this->mObjectsContext,&local_20);
  if (EVar1 == eSuccess) {
    WriteTrailerDictionary(this);
    ObjectsContext::WriteKeyword(this->mObjectsContext,&scStartXref_abi_cxx11_);
    ObjectsContext::WriteInteger(this->mObjectsContext,local_20,eTokenSeparatorEndLine);
    WriteFinalEOF(this);
    EVar1 = OutputFile::CloseFile(&this->mOutputFile);
  }
  else {
    OutputFile::CloseFile(&this->mOutputFile);
  }
  return EVar1;
}

Assistant:

EStatusCode StateWriter::Finish()
{
	EStatusCode status;
	do
	{
		LongFilePositionType xrefTablePosition;

		status = mObjectsContext->WriteXrefTable(xrefTablePosition);
		if(status != 0)
			break;

		WriteTrailerDictionary();
		WriteXrefReference(xrefTablePosition);
		WriteFinalEOF();


	} while(false);
		
	if(PDFHummus::eSuccess == status)
		status = mOutputFile.CloseFile();
	else
		mOutputFile.CloseFile();
	return status;	
}